

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O0

void parse_array_should_parse_arrays_with_multiple_elements(void)

{
  long lVar1;
  long in_FS_OFFSET;
  cJSON *local_48;
  cJSON *node;
  size_t i;
  int expected_types [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  assert_parse_array("[1\t,\n2, 3]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x6a);
  }
  if ((item[0].child)->next == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x6b);
  }
  if ((item[0].child)->next->next == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x6c);
  }
  if ((item[0].child)->next->next->next != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x6d);
  }
  UnityAssertBits(0xff,8,(long)(item[0].child)->type,"Item doesn\'t have expected type.",0x6e);
  UnityAssertBits(0xff,8,(long)(item[0].child)->next->type,"Item doesn\'t have expected type.",0x6f)
  ;
  UnityAssertBits(0xff,8,(long)(item[0].child)->next->next->type,"Item doesn\'t have expected type."
                  ,0x70);
  reset(item);
  expected_types[0] = 2;
  expected_types[1] = 1;
  expected_types[2] = 0x20;
  expected_types[3] = 0x10;
  expected_types[4] = 0x40;
  assert_parse_array("[1, null, true, false, [], \"hello\", {}]");
  local_48 = item[0].child;
  for (node = (cJSON *)0x0; node < (cJSON *)0x7 && local_48 != (cJSON *)0x0;
      node = (cJSON *)((long)&node->next + 1)) {
    UnityAssertBits(0xff,(long)expected_types[(long)((long)&node[-1].string + 6)],
                    (long)local_48->type,0,0x89);
    local_48 = local_48->next;
  }
  UnityAssertEqualNumber(node,7,0,0x8b,0x14);
  reset(item);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_array_should_parse_arrays_with_multiple_elements(void)
{
    assert_parse_array("[1\t,\n2, 3]");
    assert_has_child(item);
    TEST_ASSERT_NOT_NULL(item->child->next);
    TEST_ASSERT_NOT_NULL(item->child->next->next);
    TEST_ASSERT_NULL(item->child->next->next->next);
    assert_has_type(item->child, cJSON_Number);
    assert_has_type(item->child->next, cJSON_Number);
    assert_has_type(item->child->next->next, cJSON_Number);
    reset(item);

    {
        size_t i = 0;
        cJSON *node = NULL;
        int expected_types[7] =
        {
            cJSON_Number,
            cJSON_NULL,
            cJSON_True,
            cJSON_False,
            cJSON_Array,
            cJSON_String,
            cJSON_Object
        };
        assert_parse_array("[1, null, true, false, [], \"hello\", {}]");

        node = item->child;
        for (
                i = 0;
                (i < (sizeof(expected_types)/sizeof(int)))
                && (node != NULL);
                (void)i++, node = node->next)
        {
            TEST_ASSERT_BITS(0xFF, expected_types[i], node->type);
        }
        TEST_ASSERT_EQUAL_INT(i, 7);
        reset(item);
    }
}